

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

ON_ClassArray<ON_SubDEdgePtr> * __thiscall
ON_ClassArray<ON_ClassArray<ON_SubDEdgePtr>_>::SetCapacity
          (ON_ClassArray<ON_ClassArray<ON_SubDEdgePtr>_> *this,size_t new_capacity)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ON_ClassArray<ON_SubDEdgePtr> *pOVar3;
  
  uVar7 = this->m_capacity;
  uVar8 = (ulong)uVar7;
  if (uVar8 == 0) {
    this->m_a = (ON_ClassArray<ON_SubDEdgePtr> *)0x0;
    this->m_count = 0;
  }
  uVar6 = (uint)new_capacity;
  if (0x7ffffffe < new_capacity - 1 >> 1) {
    uVar6 = 0;
  }
  if ((int)uVar6 < 1) {
    if (this->m_a != (ON_ClassArray<ON_SubDEdgePtr> *)0x0) {
      if (0 < (int)uVar7) {
        lVar4 = uVar8 + 1;
        lVar5 = uVar8 * 0x18;
        do {
          (*(code *)**(undefined8 **)((long)&this->m_a[-1]._vptr_ON_ClassArray + lVar5))
                    ((long)&this->m_a[-1]._vptr_ON_ClassArray + lVar5);
          lVar4 = lVar4 + -1;
          lVar5 = lVar5 + -0x18;
        } while (1 < lVar4);
      }
      (*this->_vptr_ON_ClassArray[4])(this,this->m_a,0);
      this->m_a = (ON_ClassArray<ON_SubDEdgePtr> *)0x0;
    }
  }
  else if ((int)uVar7 < (int)uVar6) {
    iVar2 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)uVar6);
    pOVar3 = (ON_ClassArray<ON_SubDEdgePtr> *)CONCAT44(extraout_var,iVar2);
    this->m_a = pOVar3;
    if (pOVar3 != (ON_ClassArray<ON_SubDEdgePtr> *)0x0) {
      memset(pOVar3 + this->m_capacity,0,((long)(int)uVar6 - (long)this->m_capacity) * 0x18);
      iVar2 = this->m_capacity;
      if (iVar2 < (int)uVar6) {
        lVar5 = (long)iVar2 * 0x18 + 8;
        lVar4 = (ulong)uVar6 - (long)iVar2;
        do {
          pOVar3 = this->m_a;
          *(undefined ***)((long)pOVar3 + lVar5 + -8) = &PTR__ON_ClassArray_008292d0;
          puVar1 = (undefined8 *)((long)&pOVar3->_vptr_ON_ClassArray + lVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar5 = lVar5 + 0x18;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      this->m_capacity = uVar6;
      goto LAB_0061dae2;
    }
  }
  else {
    if ((int)uVar7 <= (int)uVar6) goto LAB_0061dae2;
    do {
      uVar7 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar7;
      (**this->m_a[uVar8]._vptr_ON_ClassArray)();
    } while ((int)uVar6 < (int)uVar7);
    if ((int)uVar6 < this->m_count) {
      this->m_count = uVar6;
    }
    this->m_capacity = uVar6;
    iVar2 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)uVar6);
    this->m_a = (ON_ClassArray<ON_SubDEdgePtr> *)CONCAT44(extraout_var_00,iVar2);
    if ((ON_ClassArray<ON_SubDEdgePtr> *)CONCAT44(extraout_var_00,iVar2) !=
        (ON_ClassArray<ON_SubDEdgePtr> *)0x0) goto LAB_0061dae2;
  }
  this->m_count = 0;
  this->m_capacity = 0;
LAB_0061dae2:
  return this->m_a;
}

Assistant:

T* ON_ClassArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }
  // uses "placement" for class construction/destruction
  int i;
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX)
               ? (int)new_capacity 
               : 0;

  if ( capacity <= 0 ) {
    if ( m_a ) {
      for ( i = m_capacity-1; i >= 0; i-- ) {
        DestroyElement(m_a[i]);
      }
      Realloc(m_a,0);
      m_a = 0;
    }
    m_count = 0;
    m_capacity = 0;
  }
  else if ( m_capacity < capacity ) {
    // growing
    m_a = Realloc( m_a, capacity );
    // initialize new elements with default constructor
    if ( 0 != m_a )
    {
      // even when m_a is an array of classes with vtable pointers,
      // this call to memset(..., 0, ...) is what I want to do
      // because in-place construction will be used when needed
      // on this memory.
      memset( (void*)(m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
      for ( i = m_capacity; i < capacity; i++ ) {
        ConstructDefaultElement(&m_a[i]);
      }
      m_capacity = capacity;
    }
    else
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  else if ( m_capacity > capacity ) {
    // shrinking
    for ( i = m_capacity-1; i >= capacity; i-- ) {
      DestroyElement(m_a[i]);
    }
    if ( m_count > capacity )
      m_count = capacity;
    m_capacity = capacity;
    m_a = Realloc( m_a, capacity );
    if ( 0 == m_a )
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  return m_a;
}